

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.h
# Opt level: O0

void __thiscall
csm::GeometricModel::Parameter::Parameter
          (Parameter *this,string *paramName,double paramValue,string *paramUnits,Type paramType,
          SharingCriteria *paramSharingCriteria)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined2 uVar6;
  SharingCriteria *paramSharingCriteria_local;
  Type paramType_local;
  string *paramUnits_local;
  double paramValue_local;
  string *paramName_local;
  Parameter *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)paramName);
  this->value = paramValue;
  std::__cxx11::string::string((string *)&this->units,(string *)paramUnits);
  this->type = paramType;
  bVar1 = paramSharingCriteria->matchesSensorID;
  bVar2 = paramSharingCriteria->matchesPlatformID;
  bVar3 = paramSharingCriteria->matchesCollectionID;
  bVar4 = paramSharingCriteria->matchesTrajectoryID;
  bVar5 = paramSharingCriteria->matchesDateTime;
  uVar6 = *(undefined2 *)&paramSharingCriteria->field_0x6;
  (this->sharingCriteria).matchesName = paramSharingCriteria->matchesName;
  (this->sharingCriteria).matchesSensorID = bVar1;
  (this->sharingCriteria).matchesPlatformID = bVar2;
  (this->sharingCriteria).matchesCollectionID = bVar3;
  (this->sharingCriteria).matchesTrajectoryID = bVar4;
  (this->sharingCriteria).matchesDateTime = bVar5;
  *(undefined2 *)&(this->sharingCriteria).field_0x6 = uVar6;
  (this->sharingCriteria).maxTimeDelta = paramSharingCriteria->maxTimeDelta;
  return;
}

Assistant:

Parameter(const std::string&      paramName,
                double                  paramValue,
                const std::string&      paramUnits,
                param::Type             paramType,
                const SharingCriteria&  paramSharingCriteria)
         :
            name            (paramName),
            value           (paramValue),
            units           (paramUnits),
            type            (paramType),
            sharingCriteria (paramSharingCriteria)
      {}